

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

void __thiscall sing::HttpContext::~HttpContext(HttpContext *this)

{
  close(this->fd);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->timer).super___weak_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  HttpResponse::~HttpResponse(&this->response);
  HttpRequest::~HttpRequest(&this->request);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->output).buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->input).buffer.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

HttpContext::~HttpContext(){
    close(fd);// FIX ME
}